

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

bool upb::generator::reflection::ParseOptions(string_view parameter,Options *options,string *error)

{
  bool bVar1;
  Arg *in_R8;
  pointer __lhs;
  string_view text;
  string_view format;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  string local_78;
  size_type local_58;
  pointer local_50;
  
  text._M_str = (char *)error;
  text._M_len = (size_t)parameter._M_str;
  ParseGeneratorParameter_abi_cxx11_(&local_90,(generator *)parameter._M_len,text);
  __lhs = local_90.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__lhs == local_90.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) {
LAB_002386e1:
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_90);
      return __lhs == local_90.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    }
    bVar1 = std::operator==(&__lhs->first,"dllexport_decl");
    if (!bVar1) {
      local_50 = (__lhs->first)._M_dataplus._M_p;
      local_58 = (__lhs->first)._M_string_length;
      format._M_str = (char *)&local_58;
      format._M_len = (size_t)"Unknown parameter: $0";
      absl::lts_20250127::Substitute_abi_cxx11_(&local_78,(lts_20250127 *)0x15,format,in_R8);
      std::__cxx11::string::operator=((string *)error,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      goto LAB_002386e1;
    }
    std::__cxx11::string::_M_assign((string *)options);
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

bool ParseOptions(absl::string_view parameter, Options* options,
                  std::string* error) {
  for (const auto& pair : ParseGeneratorParameter(parameter)) {
    if (pair.first == "dllexport_decl") {
      options->dllexport_decl = pair.second;
    } else {
      *error = absl::Substitute("Unknown parameter: $0", pair.first);
      return false;
    }
  }

  return true;
}